

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

DescriptorFlags __thiscall
Js::SimpleTypeHandler<1UL>::GetSetter
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId,
          Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  DescriptorFlags DVar6;
  uint uVar7;
  uint32 local_2c [2];
  uint32 indexVal;
  
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
  iVar2 = this->propertyCount;
  bVar3 = 0 < iVar2;
  if (0 < iVar2) {
    if ((this->descriptors[0].Id.ptr)->pid != propertyId) {
      uVar7 = 1;
      do {
        uVar4 = uVar7 & 0xffff;
        bVar3 = (int)uVar4 < iVar2;
        if (iVar2 <= (int)uVar4) break;
        uVar7 = uVar4 + 1;
      } while (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar4 << 4)) + 8) !=
               propertyId);
      goto LAB_00e4fb3d;
    }
    bVar3 = true;
  }
  uVar4 = 0;
LAB_00e4fb3d:
  if (bVar3) {
    bVar1 = *(byte *)((long)&this->descriptors[0].field_1 + (ulong)(uVar4 << 4));
    DVar6 = None;
    if ((bVar1 & 8) == 0) {
      DVar6 = bVar1 & Writable | Data;
    }
  }
  else {
    BVar5 = ScriptContext::IsNumericPropertyId
                      ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_2c);
    if (BVar5 == 0) {
      DVar6 = None;
    }
    else {
      DVar6 = DynamicTypeHandler::GetItemSetter
                        (&this->super_DynamicTypeHandler,instance,local_2c[0],setterValue,
                         requestContext);
    }
  }
  return DVar6;
}

Assistant:

DescriptorFlags SimpleTypeHandler<size>::GetSetter(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyIndex index;
        PropertyValueInfo::SetNoCache(info, instance);
        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes & PropertyDeleted)
            {
                return None;
            }
            return (descriptors[index].Attributes & PropertyWritable) ? WritableData : Data;
        }

        uint32 indexVal;
        if (instance->GetScriptContext()->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::GetItemSetter(instance, indexVal, setterValue, requestContext);
        }

        return None;
    }